

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O3

fdb_status docio_read_doc_key(docio_handle *handle,uint64_t offset,keylen_t *keylen,void *keybuf)

{
  err_log_callback *log_callback;
  undefined8 uVar1;
  docio_length dVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  uint64_t offset_00;
  fdb_status status;
  fdb_status fVar6;
  ushort uVar7;
  size_t line_number;
  char *format;
  char *pcVar8;
  undefined1 auVar9 [16];
  docio_length _length;
  docio_length local_40;
  
  _length.keylen = 0;
  _length.metalen = 0;
  _length.bodylen = 0;
  _length.bodylen_ondisk = 0;
  _length.flag = '\0';
  _length.checksum = '\0';
  _length.reserved = 0;
  log_callback = handle->log_callback;
  offset_00 = _docio_read_length(handle,offset,&_length,log_callback,true);
  dVar2 = _length;
  if ((long)offset_00 < 0) {
    format = "Error in reading the doc length metadata with offset %lu from a database file \'%s\'";
    line_number = 0x40c;
    status = (fdb_status)offset_00;
    pcVar8 = handle->file->filename;
LAB_00111c0f:
    fVar6 = (fdb_status)offset_00;
    fdb_log_impl(log_callback,2,status,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc_key",line_number,format,offset,pcVar8);
  }
  else {
    uVar4 = _length.checksum;
    auVar9[0] = -((char)_length.keylen == '\0');
    auVar9[1] = -(_length.keylen._1_1_ == '\0');
    auVar9[2] = -((char)_length.metalen == '\0');
    auVar9[3] = -(_length.metalen._1_1_ == '\0');
    auVar9[4] = -((char)_length.bodylen == '\0');
    auVar9[5] = -(_length.bodylen._1_1_ == '\0');
    auVar9[6] = -(_length.bodylen._2_1_ == '\0');
    auVar9[7] = -(_length.bodylen._3_1_ == '\0');
    auVar9[8] = -((char)_length.bodylen_ondisk == '\0');
    auVar9[9] = -(_length.bodylen_ondisk._1_1_ == '\0');
    auVar9[10] = -(_length.bodylen_ondisk._2_1_ == '\0');
    auVar9[0xb] = -(_length.bodylen_ondisk._3_1_ == '\0');
    auVar9[0xc] = -(_length.flag == '\0');
    auVar9[0xd] = -(_length.checksum == '\0');
    auVar9[0xe] = -((char)_length.reserved == '\0');
    auVar9[0xf] = -(_length.reserved._1_1_ == '\0');
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        == 0xffff) {
      *keylen = 0;
    }
    else {
      uVar1 = _length._0_8_;
      uVar3 = _length._8_8_;
      local_40.keylen = _length.keylen;
      local_40.metalen = _length.metalen;
      local_40.bodylen = _length.bodylen;
      local_40.bodylen_ondisk = _length.bodylen_ondisk;
      local_40.flag = _length.flag;
      local_40.checksum = _length.checksum;
      local_40.reserved = _length.reserved;
      _length = dVar2;
      uVar5 = get_checksum((uint8_t *)&local_40,0xc,handle->file->crc_mode);
      if (uVar4 != (uint8_t)uVar5) {
        fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_read_doc_key",0x420,
                     "doc_length key checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                     ,handle->file->filename,(ulong)(uVar5 & 0xff),(ulong)uVar3 >> 0x28 & 0xff,
                     (ulong)(dVar2._0_4_ & 0xffff),(ulong)(dVar2._2_4_ & 0xffff),
                     (ulong)uVar1 >> 0x20,uVar3,offset);
        return FDB_RESULT_CHECKSUM_ERROR;
      }
      uVar7 = dVar2.keylen << 8 | dVar2.keylen >> 8;
      if ((ushort)(uVar7 + 0xf) < 0x10) {
        fdb_log_impl(log_callback,2,FDB_RESULT_FILE_CORRUPTION,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                     ,"docio_read_doc_key",0x42b,
                     "Error in decoding the doc key length metadata in file %s crc %x keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                     ,handle->file->filename,(ulong)(uVar5 & 0xff),(ulong)(dVar2._0_4_ & 0xffff),
                     (ulong)(dVar2._2_4_ & 0xffff),(ulong)uVar1 >> 0x20,uVar3,offset);
        return FDB_RESULT_FILE_CORRUPTION;
      }
      pcVar8 = (char *)(ulong)uVar7;
      offset_00 = _docio_read_doc_component(handle,offset_00,(uint)uVar7,keybuf,log_callback);
      if ((long)offset_00 < 0) {
        format = "Error in reading a key with offset %lu, length %d from a database file \'%s\'";
        line_number = 0x435;
        status = (fdb_status)offset_00;
        offset = offset_00;
        goto LAB_00111c0f;
      }
      *keylen = uVar7;
    }
    fVar6 = FDB_RESULT_SUCCESS;
  }
  return fVar6;
}

Assistant:

fdb_status docio_read_doc_key(struct docio_handle *handle, uint64_t offset,
                              keylen_t *keylen, void *keybuf)
{
    uint8_t checksum;
    int64_t _offset;
    struct docio_length length, _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback, true);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading the doc length metadata with offset %" _F64 " from "
                "a database file '%s'",
                offset, handle->file->filename);
        return (fdb_status) _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        *keylen = 0;
        return FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length key checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_CHECKSUM_ERROR;
    }

    length = _docio_length_decode(_length);
    if (length.keylen == 0 || length.keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc key length metadata in file %s"
                " crc %x keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return FDB_RESULT_FILE_CORRUPTION;
    }

    _offset = _docio_read_doc_component(handle, _offset, length.keylen,
                                        keybuf, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a key with offset %" _F64 ", length %d "
                "from a database file '%s'", _offset, length.keylen,
                handle->file->filename);
        return (fdb_status) _offset;
    }

    *keylen = length.keylen;
    return FDB_RESULT_SUCCESS;
}